

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

string * __thiscall
kratos::PackedSlice::to_string_abi_cxx11_(string *__return_storage_ptr__,PackedSlice *this)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar1;
  format_args args;
  string_view format_str;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_48;
  undefined8 uStack_40;
  pointer local_38;
  size_type sStack_30;
  
  if (this->original_struct_ == (PackedStruct *)0x0) {
    (*(((this->super_VarSlice).parent_var)->super_IRNode)._vptr_IRNode[0x1f])(&local_68);
    local_38 = (this->def_->name)._M_dataplus._M_p;
    sStack_30 = (this->def_->name)._M_string_length;
    local_48 = local_68;
    uStack_40 = uStack_60;
    bVar1 = fmt::v7::to_string_view<char,_0>("{0}.{1}");
    format_str.data_ = (char *)bVar1.size_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_48;
    format_str.size_ = 0xdd;
    fmt::v7::detail::vformat_abi_cxx11_
              (__return_storage_ptr__,(detail *)bVar1.data_,format_str,args);
    std::__cxx11::string::~string((string *)&local_68);
  }
  else {
    (*(((this->super_VarSlice).parent_var)->super_IRNode)._vptr_IRNode[0x1f])
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PackedSlice::to_string() const {
    if (original_struct_) {
        return parent_var->to_string();
    } else {
        return ::format("{0}.{1}", parent_var->to_string(), def_->name);
    }
}